

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  initializer_list<int> __l;
  Parser parser;
  allocator_type local_d1;
  NeuralNetwork nn;
  _Vector_base<int,_std::allocator<int>_> local_90;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  test_y;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  test_x;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  train_y;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  train_x;
  int local_18 [4];
  
  std::ios_base::sync_with_stdio(false);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nn,"../data/train-images-idx3-ubyte",(allocator<char> *)&train_y);
  Parser::parse_features(&train_x,&parser,(string *)&nn);
  std::__cxx11::string::~string((string *)&nn);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nn,"../data/train-labels-idx1-ubyte",(allocator<char> *)&test_x);
  Parser::parse_labels(&train_y,&parser,(string *)&nn);
  std::__cxx11::string::~string((string *)&nn);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nn,"../data/t10k-images-idx3-ubyte",(allocator<char> *)&test_y);
  Parser::parse_features(&test_x,&parser,(string *)&nn);
  std::__cxx11::string::~string((string *)&nn);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nn,"../data/t10k-labels-idx1-ubyte",(allocator<char> *)&local_90);
  Parser::parse_labels(&test_y,&parser,(string *)&nn);
  std::__cxx11::string::~string((string *)&nn);
  local_18[0] = 0x310;
  local_18[1] = 100;
  local_18[2] = 0x32;
  local_18[3] = 10;
  __l._M_len = 4;
  __l._M_array = local_18;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_90,__l,&local_d1);
  NeuralNetwork::NeuralNetwork
            (&nn,(vector<int,_std::allocator<int>_> *)&local_90,0.005,0x1e,0x32,relu,derive_relu);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_90);
  NeuralNetwork::train(&nn,&train_x,&train_y,&test_x,&test_y);
  std::vector<Layer,_std::allocator<Layer>_>::~vector(&nn.layers_);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&test_y);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&test_x);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&train_y);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&train_x);
  return 0;
}

Assistant:

int main(int, char**) {
    std::ios::sync_with_stdio(false);
    Parser parser;
    using namespace std;
    // MNIST数据集
    auto train_x = parser.parse_features("../data/train-images-idx3-ubyte");
    auto train_y = parser.parse_labels("../data/train-labels-idx1-ubyte");
    auto test_x = parser.parse_features("../data/t10k-images-idx3-ubyte");
    auto test_y = parser.parse_labels("../data/t10k-labels-idx1-ubyte");
    //参数{28 * 28, 50, 10}表示构建一个三层的神经网络，其中
    //输入层是28*28=784个节点，隐层是50个节点，输出层是10个节点，隐层数量可以增加，第一个和最后一个总是表示输入层和输出层的节点数量
    NeuralNetwork nn({28 * 28, 100,50, 10}, 0.005, 30, 50, &relu, &derive_relu);
    // NeuralNetwork nn({28 * 28, 150, 10}, 0.005, 30, 20);
    nn.train(train_x, train_y, test_x, test_y);

    return 0;
}